

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O2

void __thiscall ManchesterAnalyzer::ProcessBiPhaseData(ManchesterAnalyzer *this)

{
  U32 UVar1;
  ManchesterMode MVar2;
  U64 location;
  long lVar3;
  ulong uVar4;
  long lVar5;
  U32 UVar6;
  
  if (this->mSynchronized != true) {
    return;
  }
  location = AnalyzerChannelData::GetSampleNumber();
  AnalyzerChannelData::AdvanceToNextEdge();
  lVar3 = AnalyzerChannelData::GetSampleNumber();
  uVar4 = lVar3 - location;
  UVar6 = this->mT;
  UVar1 = this->mTError;
  if (uVar4 < UVar1 + UVar6 * 2 && UVar6 * 2 - UVar1 < uVar4) {
    MVar2 = ((this->mSettings)._M_ptr)->mMode;
    if (MVar2 == BI_PHASE_SPACE) {
      UVar6 = 1;
    }
    else {
      if (MVar2 != BI_PHASE_MARK) {
        return;
      }
      UVar6 = 0;
    }
    SaveBit(this,location,UVar6);
    return;
  }
  MVar2 = ((this->mSettings)._M_ptr)->mMode;
  if (UVar1 + UVar6 <= uVar4 || uVar4 <= UVar6 - UVar1) {
    if (MVar2 == BI_PHASE_MARK) {
      UVar6 = 0;
    }
    else {
      if (MVar2 != BI_PHASE_SPACE) goto LAB_0010768c;
      UVar6 = 1;
    }
    SaveBit(this,location,UVar6);
    goto LAB_0010768c;
  }
  if (MVar2 == BI_PHASE_MARK) {
    UVar6 = 1;
LAB_0010762d:
    SaveBit(this,location,UVar6);
  }
  else if (MVar2 == BI_PHASE_SPACE) {
    UVar6 = 0;
    goto LAB_0010762d;
  }
  lVar3 = AnalyzerChannelData::GetSampleNumber();
  AnalyzerChannelData::AdvanceToNextEdge();
  lVar5 = AnalyzerChannelData::GetSampleNumber();
  if ((ulong)(this->mT - this->mTError) < (ulong)(lVar5 - lVar3) &&
      (ulong)(lVar5 - lVar3) < (ulong)(this->mTError + this->mT)) {
    return;
  }
LAB_0010768c:
  Invalidate(this);
  return;
}

Assistant:

void ManchesterAnalyzer::ProcessBiPhaseData()
{
    if( mSynchronized == true )
    {
        U64 edge_location = mManchester->GetSampleNumber();

        mManchester->AdvanceToNextEdge();
        U64 next_edge_location = mManchester->GetSampleNumber();
        U64 edge_distance = next_edge_location - edge_location;
        if( ( edge_distance > ( ( 2 * mT ) - mTError ) ) && ( edge_distance < ( ( 2 * mT ) + mTError ) ) ) // long
        {
            if( mSettings->mMode == BI_PHASE_MARK ) // FM1
                SaveBit( edge_location, 0 );
            else if( mSettings->mMode == BI_PHASE_SPACE ) // FM0
                SaveBit( edge_location, 1 );
            return;
        }
        else if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short
        {
            if( mSettings->mMode == BI_PHASE_MARK ) // FM1
                SaveBit( edge_location, 1 );
            else if( mSettings->mMode == BI_PHASE_SPACE ) // FM0
                SaveBit( edge_location, 0 );

            edge_location = mManchester->GetSampleNumber();
            mManchester->AdvanceToNextEdge();
            next_edge_location = mManchester->GetSampleNumber();
            edge_distance = next_edge_location - edge_location;
            if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short.
            {
                return;
            }
            else
            {
                Invalidate();
                return;
                // not synced anymore.
            }
        }
        else
        {
            // record first, then invalidate. (long)
            if( mSettings->mMode == BI_PHASE_MARK ) // FM1
                SaveBit( edge_location, 0 );
            else if( mSettings->mMode == BI_PHASE_SPACE ) // FM0
                SaveBit( edge_location, 1 );
            Invalidate();
            return;
            // not synced anymore.
        }
    }
    return;
}